

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O3

BasicBlock * __thiscall spvtools::opt::Loop::FindLatchBlock(Loop *this)

{
  IRContext *this_00;
  CFG *this_01;
  Instruction *pIVar1;
  uint32_t *puVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t a;
  DominatorTree *this_02;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  BasicBlock *pBVar6;
  IRContext *this_03;
  uint32_t *puVar7;
  
  this_00 = this->context_;
  this_03 = this_00;
  if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(this_00);
    this_03 = this->context_;
  }
  this_01 = (this_00->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  this_02 = (DominatorTree *)IRContext::GetDominatorAnalysis(this_03,this->loop_header_->function_);
  pIVar1 = (this->loop_header_->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar4 = 0;
  if (pIVar1->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
  }
  pvVar5 = CFG::preds(this_01,uVar4);
  puVar7 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar7 == puVar2) {
      __assert_fail("false && \"Every loop should have a latch block dominated by the continue target\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                    ,0x15c,"BasicBlock *spvtools::opt::Loop::FindLatchBlock()");
    }
    uVar4 = *puVar7;
    pIVar1 = (this->loop_continue_->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    a = 0;
    if (pIVar1->has_result_id_ == true) {
      a = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
    }
    bVar3 = DominatorTree::Dominates(this_02,a,uVar4);
    if (bVar3) break;
    puVar7 = puVar7 + 1;
  }
  pBVar6 = CFG::block(this_01,uVar4);
  return pBVar6;
}

Assistant:

BasicBlock* Loop::FindLatchBlock() {
  CFG* cfg = context_->cfg();

  DominatorAnalysis* dominator_analysis =
      context_->GetDominatorAnalysis(loop_header_->GetParent());

  // Look at the predecessors of the loop header to find a predecessor block
  // which is dominated by the loop continue target. There should only be one
  // block which meets this criteria and this is the latch block, as per the
  // SPIR-V spec.
  for (uint32_t block_id : cfg->preds(loop_header_->id())) {
    if (dominator_analysis->Dominates(loop_continue_->id(), block_id)) {
      return cfg->block(block_id);
    }
  }

  assert(
      false &&
      "Every loop should have a latch block dominated by the continue target");
  return nullptr;
}